

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O0

int main(void)

{
  char cVar1;
  ostream *poVar2;
  double dVar3;
  int local_70;
  int32_t result;
  char answer;
  string local_38;
  int local_14;
  int local_10;
  int32_t b;
  int32_t a;
  
  b = 0;
  local_10 = 0;
  local_14 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter two numbers a and b:\n");
  std::operator<<(poVar2,"a: ");
  readNumber_abi_cxx11_();
  local_10 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<((ostream *)&std::cout,"b: ");
  readNumber_abi_cxx11_();
  local_14 = std::__cxx11::stoi((string *)&result,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&result);
  cVar1 = promptCalculationType();
  if (cVar1 == 'P') {
    dVar3 = permutations(local_10,local_14);
  }
  else {
    dVar3 = combinations(local_10,local_14);
  }
  local_70 = (int)dVar3;
  poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2,") = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main()
{
	int32_t a = 0;
	int32_t b = 0;
	std::cout << "Enter two numbers a and b:\n"
			  << "a: ";
	a = std::stoi(readNumber());
	std::cout << "b: ";
	b = std::stoi(readNumber());

	auto answer = promptCalculationType();
	int32_t result = 0;
	if (answer == 'P')
		result = permutations(a, b);
	else
		result = combinations(a, b);
	std::cout << answer << "(" << a << ", " << b << ") = " << result << '\n';
	return 0;
}